

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O3

bool __thiscall ON_Brep::SetTrimStartVertex(ON_Brep *this,int ti0,int vi)

{
  int iVar1;
  ON_BrepEdge *pOVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ON_BrepTrim *pOVar6;
  int iVar7;
  ON_BrepTrim *pOVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  bool bVar13;
  uint local_48;
  uint local_44;
  int local_40;
  uint local_3c;
  ON_BrepTrim *local_38;
  
  if (-1 < (vi | ti0)) {
    local_3c = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.
               m_count;
    local_48 = 0;
    local_40 = vi;
    if (-1 < ti0) {
      uVar4 = ti0;
      uVar11 = 0;
      do {
        uVar3 = local_48;
        if (((uVar11 != 0) && (uVar4 == ti0)) && (local_48 == 0)) {
          return true;
        }
        pOVar8 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a;
        if (pOVar8[uVar4].m_type == singular) {
          pOVar8[uVar4].m_vi[1] = local_40;
          pOVar8[uVar4].m_vi[0] = local_40;
          if (local_48 == 1) {
            local_44 = PrevTrim(this,uVar4);
          }
          else {
            local_44 = NextTrim(this,uVar4);
            local_48 = uVar3;
            if (local_44 == ti0 && uVar3 == 0) {
              return true;
            }
          }
          if (pOVar8[(int)local_44].m_type != singular) {
            HopAcrossEdge(this,(int *)&local_44,(int *)&local_48);
          }
        }
        else {
          uVar10 = 1 - local_48;
          uVar9 = local_48;
          if (pOVar8[uVar4].m_bRev3d != false) {
            uVar9 = uVar10;
          }
          bVar13 = SetEdgeVertex(this,pOVar8[uVar4].m_ei,uVar9,local_40);
          if (!bVar13) {
            return false;
          }
          if (uVar3 == 0) {
            local_44 = PrevTrim(this,uVar4);
          }
          else {
            local_44 = NextTrim(this,uVar4);
          }
          if ((int)local_44 < 0) {
            return false;
          }
          pOVar8 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
                   m_a;
          local_48 = uVar10;
          if (pOVar8[local_44].m_type != singular) {
            iVar7 = pOVar8[local_44].m_ei;
            if ((long)iVar7 < 0) {
              return false;
            }
            if ((int)local_3c <= iVar7) {
              return false;
            }
            iVar1 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.
                    m_a[iVar7].m_ti.m_count;
            if (iVar1 < 1) break;
            if (iVar1 == 1) {
              if (pOVar8[local_44].m_bRev3d != false) {
                uVar10 = uVar3;
              }
              SetEdgeVertex(this,iVar7,uVar10,local_40);
              break;
            }
            bVar13 = HopAcrossEdge(this,(int *)&local_44,(int *)&local_48);
            if (!bVar13) {
              return false;
            }
          }
        }
        if (((int)local_44 < 0) ||
           (bVar13 = 0x1fe < uVar11, uVar4 = local_44, uVar11 = uVar11 + 1, bVar13)) break;
      } while( true );
    }
    local_48 = 0;
    pOVar6 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a;
    pOVar8 = pOVar6 + ti0;
    uVar4 = ti0;
    local_44 = ti0;
    if (pOVar6[ti0].m_type == singular) {
      do {
        if (uVar4 != ti0) {
          pOVar8->m_vi[0] = local_40;
          pOVar8->m_vi[1] = local_40;
        }
        uVar4 = PrevTrim(this,uVar4);
        uVar11 = ti0;
      } while ((uVar4 != ti0) &&
              (pOVar8 = pOVar6 + (int)uVar4, uVar11 = uVar4, pOVar6[(int)uVar4].m_type == singular))
      ;
      local_48 = 1;
      uVar4 = pOVar6[(int)uVar11].m_ei;
      if ((int)uVar4 < 0) {
        return true;
      }
      local_44 = uVar11;
      SetEdgeVertex(this,uVar4,pOVar6[(int)uVar11].m_bRev3d ^ 1,local_40);
    }
    else {
      uVar4 = pOVar8->m_ei;
      if ((int)uVar4 < 0) {
        return true;
      }
    }
    pOVar2 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a;
    if (pOVar2[uVar4].m_ti.m_count < 2) {
      return true;
    }
    bVar13 = HopAcrossEdge(this,(int *)&local_44,(int *)&local_48);
    uVar4 = local_48;
    if (bVar13) {
      if (local_48 == 0) {
        local_44 = PrevTrim(this,local_44);
      }
      else {
        local_44 = NextTrim(this,local_44);
      }
      uVar5 = (ulong)local_44;
      if (-1 < (int)local_44) {
        uVar11 = 1 - uVar4;
        pOVar8 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a;
        local_48 = uVar11;
        if (pOVar8[uVar5].m_type != singular) {
          pOVar6 = pOVar8 + uVar5;
          iVar7 = pOVar6->m_ei;
          if ((long)iVar7 < 0) {
            return false;
          }
          if (pOVar2[iVar7].m_ti.m_count == 1) {
LAB_003f03be:
            uVar3 = uVar11;
            if (pOVar6->m_bRev3d != false) {
              uVar3 = uVar4;
            }
            local_48 = uVar11;
            SetEdgeVertex(this,iVar7,uVar3,local_40);
            return true;
          }
          bVar13 = HopAcrossEdge(this,(int *)&local_44,(int *)&local_48);
          if (!bVar13) {
            return false;
          }
          uVar5 = (ulong)local_44;
          if ((int)local_44 < 0) {
            return false;
          }
        }
        uVar3 = local_48;
        local_3c = (uint)uVar5;
        uVar12 = uVar5;
        uVar9 = 0;
        while( true ) {
          uVar4 = local_48;
          iVar7 = (int)uVar12;
          uVar11 = local_48 ^ uVar3;
          if ((iVar7 == (int)uVar5 && uVar11 == 0) && uVar9 != 0) break;
          if (pOVar8[uVar12].m_type == singular) {
            pOVar8[uVar12].m_vi[1] = local_40;
            pOVar8[uVar12].m_vi[0] = local_40;
            local_38 = pOVar8;
            if (local_48 == 1) {
              local_44 = PrevTrim(this,iVar7);
            }
            else {
              local_44 = NextTrim(this,iVar7);
            }
            uVar5 = (ulong)local_3c;
            if (local_44 == local_3c && uVar11 == 0) {
              return false;
            }
            pOVar8 = local_38;
            local_48 = uVar4;
            if (local_38[(int)local_44].m_type != singular) {
              HopAcrossEdge(this,(int *)&local_44,(int *)&local_48);
              uVar5 = (ulong)local_3c;
              pOVar8 = local_38;
            }
          }
          else {
            uVar11 = 1 - local_48;
            uVar10 = local_48;
            if (pOVar8[uVar12].m_bRev3d != false) {
              uVar10 = uVar11;
            }
            bVar13 = SetEdgeVertex(this,pOVar8[uVar12].m_ei,uVar10,local_40);
            if (!bVar13) {
              return false;
            }
            if (uVar4 == 0) {
              local_44 = PrevTrim(this,iVar7);
            }
            else {
              local_44 = NextTrim(this,iVar7);
            }
            uVar5 = (ulong)local_3c;
            if ((int)local_44 < 0) {
              return false;
            }
            pOVar8 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
                     m_a;
            local_48 = uVar11;
            if (pOVar8[local_44].m_type != singular) {
              pOVar6 = pOVar8 + local_44;
              iVar7 = pOVar6->m_ei;
              if ((long)iVar7 < 0) {
                return false;
              }
              iVar1 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>
                      .m_a[iVar7].m_ti.m_count;
              if (iVar1 < 1) {
                return false;
              }
              if (iVar1 == 1) goto LAB_003f03be;
              bVar13 = HopAcrossEdge(this,(int *)&local_44,(int *)&local_48);
              uVar5 = (ulong)local_3c;
              if (!bVar13) {
                return false;
              }
            }
          }
          uVar12 = (ulong)local_44;
          if ((int)local_44 < 0) {
            return false;
          }
          bVar13 = 0x1fe < uVar9;
          uVar9 = uVar9 + 1;
          if (bVar13) {
            return false;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_Brep::SetTrimStartVertex( const int ti0, const int vi )
{
  // Do not use NextEdge(), PrevEdge() because they require
  // the information we are in the act of creating.
  if ( ti0 < 0 || vi < 0 )
    return false;
  int next_ti, ti, ei, evi, tvi, counter;

  const int edge_count = m_E.Count();

  // Step counter clockwise around vertex until we hit a boundary
  // or we get back to where we started.
  for ( ti = ti0, tvi = 0, counter = 0; ti >= 0 && counter < 512; counter++ ) {
    if ( counter > 0 ) {
      if ( ti == ti0 && tvi == 0 )
        return true; // vertex was interior
    }
    ON_BrepTrim& trim = m_T[ti];
    if ( trim.m_type == ON_BrepTrim::singular ) {
      trim.m_vi[0] = trim.m_vi[1] = vi;
      tvi = 1-tvi;
      next_ti = (tvi) ? NextTrim(ti) : PrevTrim(ti);
      ti = next_ti;
      tvi = 1-tvi;
      if ( ti == ti0 && tvi == 0 )
        return true; // vertex was interior
      if ( m_T[ti].m_type != ON_BrepTrim::singular )
        HopAcrossEdge( ti, tvi ); // OK if hop fails because ti is a boundary
      continue;
    }

    ei = trim.m_ei;
    evi = (trim.m_bRev3d) ? 1-tvi : tvi;
    if ( !SetEdgeVertex( ei, evi, vi ) )
      return false;
    next_ti = (tvi) ? NextTrim(ti) : PrevTrim(ti);
    ti = next_ti;
    tvi = 1-tvi;
    if ( ti < 0 )
      return false; // should not happen

    if ( m_T[ti].m_type == ON_BrepTrim::singular )
      continue;
    ei = m_T[ti].m_ei;
    if ( ei < 0 || ei >= edge_count )
      return false; // should not happen
    evi = (m_T[ti].m_bRev3d) ? 1-tvi : tvi;
    const int edge_trim_count = m_E[ei].m_ti.Count();
    if ( edge_trim_count < 1 )
      break; // should not happen
    if ( edge_trim_count == 1 ) {
      SetEdgeVertex( ei, evi, vi );
      break; // ran into boundary
    }
    if ( !HopAcrossEdge( ti, tvi ) )
      return false;
  }


  // Get ready to step counter clockwise around vertex until
  // we hit a boundary.
  ti = ti0;
  tvi = 0;
  if ( m_T[ti].m_type == ON_BrepTrim::singular ) {
    // back up until we get to a non-singular trim
    while ( m_T[ti].m_type == ON_BrepTrim::singular ) {
      if ( ti != ti0 ) {
        m_T[ti].m_vi[0] = vi;
        m_T[ti].m_vi[1] = vi;
      }
      ti = PrevTrim(ti);
      tvi = 1;
      if ( ti == ti0 )
        break;
    }
    ei = m_T[ti].m_ei;
    if ( ei >= 0 ) {
      evi = (m_T[ti].m_bRev3d) ? 1-tvi : tvi;
      SetEdgeVertex( ei, evi, vi );
    }
  }
  else {
    ei = m_T[ti].m_ei;
  }
  if ( ei < 0 ) {
    // did the best we could - return true so setter keeps going
    // but the fact we are here means the brep is bogus.
    return true;
  }
  if ( m_E[ei].m_ti.Count() < 2 )
    return true; // ti0 is a boundary - we're done.
  if ( !HopAcrossEdge( ti, tvi ) )
    return false;
  next_ti = (tvi) ? NextTrim(ti) : PrevTrim(ti);
  if ( next_ti < 0 )
    return false;
  ti = next_ti;
  tvi = 1-tvi;
  if ( m_T[ti].m_type != ON_BrepTrim::singular ) {
    ei = m_T[ti].m_ei;
    if ( ei < 0 )
      return false;
    if ( m_E[ei].m_ti.Count() == 1 ) {
      evi = (m_T[ti].m_bRev3d)? 1-tvi : tvi;
      SetEdgeVertex( ei, evi, vi );
      return true;
    }
    if ( !HopAcrossEdge( ti, tvi ) )
      return false;
  }

  const int ti1 = ti;
  const int tvi1 = tvi;
  
  for ( ti = ti1, tvi = tvi1, counter = 0; ti >= 0 && counter < 512; counter++ ) {
    if ( counter > 0 ) {
      if ( ti == ti1 && tvi == tvi1 )
        return false; // vertex is not interior - so this should not happen
    }
    ON_BrepTrim& trim = m_T[ti];
    if ( trim.m_type == ON_BrepTrim::singular ) {
      trim.m_vi[0] = trim.m_vi[1] = vi;
      tvi = 1-tvi;
      next_ti = (tvi) ? NextTrim(ti) : PrevTrim(ti);
      ti = next_ti;
      tvi = 1-tvi;
      if ( ti == ti1 && tvi == tvi1 )
        return false; // vertex is not interior - so this should not happen
      if ( m_T[ti].m_type != ON_BrepTrim::singular )
        HopAcrossEdge( ti, tvi );  // OK if hop fails because ti is a boundary
      continue;
    }

    ei = trim.m_ei;
    evi = (trim.m_bRev3d) ? 1-tvi : tvi;
    if ( !SetEdgeVertex( ei, evi, vi ) )
      return false;
    next_ti = (tvi) ? NextTrim(ti) : PrevTrim(ti);
    ti = next_ti;
    tvi = 1-tvi;
    if ( ti < 0 )
      return false; // should not happen
    
    if ( m_T[ti].m_type == ON_BrepTrim::singular )
      continue;
    ei = m_T[ti].m_ei;
    if ( ei < 0 )
      return false; // should not happen
    evi = (m_T[ti].m_bRev3d) ? 1-tvi : tvi;
    const int edge_trim_count = m_E[ei].m_ti.Count();
    if ( edge_trim_count < 1 )
      break; // should not happen
    if ( edge_trim_count == 1 ) {
      SetEdgeVertex( ei, evi, vi );
      return true; // ran into boundary - expected
    }
    if ( !HopAcrossEdge( ti, tvi ) )
      return false;
  }

  return false; // should have exited by hitting "expected" boundary ~10 lines above
}